

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::AddVarint(UnknownFieldSet *this,int number,uint64_t value)

{
  pointer this_00;
  UnknownField *field;
  uint64_t value_local;
  int number_local;
  UnknownFieldSet *this_local;
  
  this_00 = RepeatedField<google::protobuf::UnknownField>::Add(&this->fields_);
  this_00->number_ = number;
  UnknownField::SetType(this_00,TYPE_VARINT);
  (this_00->data_).varint_ = value;
  return;
}

Assistant:

void UnknownFieldSet::AddVarint(int number, uint64_t value) {
  auto& field = *fields_.Add();
  field.number_ = number;
  field.SetType(UnknownField::TYPE_VARINT);
  field.data_.varint_ = value;
}